

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O0

size_t despace_avx2_vpermd(void *dst_void,void *src_void,size_t length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  size_t sVar18;
  ulong in_RDX;
  undefined1 (*in_RSI) [32];
  undefined8 *in_RDI;
  undefined1 auVar19 [16];
  __m256i r4;
  __m256i r3;
  __m256i r2;
  __m256i r1;
  __m256i r0;
  __m256i lut;
  __m256i mask_fixup;
  __m256i mask_invert;
  __m256i mask_shift;
  __m256i mask_index;
  __m256i lut_cntrl;
  __m256i mask_70;
  __m256i mask_20;
  uint8_t *dst;
  uint8_t *src;
  long local_860;
  long lStack_858;
  long lStack_850;
  long lStack_848;
  undefined1 local_820 [16];
  ulong uStack_810;
  ulong uStack_808;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 *local_6b0;
  undefined1 (*local_6a8) [32];
  ulong local_6a0;
  undefined8 uStack_630;
  undefined8 uStack_628;
  ulong local_600;
  ulong uStack_5f8;
  ulong uStack_5f0;
  ulong uStack_5e8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar1 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar1 = vpinsrb_avx(auVar1,0x20,2);
  auVar1 = vpinsrb_avx(auVar1,0x20,3);
  auVar1 = vpinsrb_avx(auVar1,0x20,4);
  auVar1 = vpinsrb_avx(auVar1,0x20,5);
  auVar1 = vpinsrb_avx(auVar1,0x20,6);
  auVar1 = vpinsrb_avx(auVar1,0x20,7);
  auVar1 = vpinsrb_avx(auVar1,0x20,8);
  auVar1 = vpinsrb_avx(auVar1,0x20,9);
  auVar1 = vpinsrb_avx(auVar1,0x20,10);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar2 = vpinsrb_avx(auVar2,0x20,2);
  auVar2 = vpinsrb_avx(auVar2,0x20,3);
  auVar2 = vpinsrb_avx(auVar2,0x20,4);
  auVar2 = vpinsrb_avx(auVar2,0x20,5);
  auVar2 = vpinsrb_avx(auVar2,0x20,6);
  auVar2 = vpinsrb_avx(auVar2,0x20,7);
  auVar2 = vpinsrb_avx(auVar2,0x20,8);
  auVar2 = vpinsrb_avx(auVar2,0x20,9);
  auVar2 = vpinsrb_avx(auVar2,0x20,10);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x20,0xf);
  uStack_190 = auVar2._0_8_;
  uStack_188 = auVar2._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(0x70),0x70,1);
  auVar2 = vpinsrb_avx(auVar2,0x70,2);
  auVar2 = vpinsrb_avx(auVar2,0x70,3);
  auVar2 = vpinsrb_avx(auVar2,0x70,4);
  auVar2 = vpinsrb_avx(auVar2,0x70,5);
  auVar2 = vpinsrb_avx(auVar2,0x70,6);
  auVar2 = vpinsrb_avx(auVar2,0x70,7);
  auVar2 = vpinsrb_avx(auVar2,0x70,8);
  auVar2 = vpinsrb_avx(auVar2,0x70,9);
  auVar2 = vpinsrb_avx(auVar2,0x70,10);
  auVar2 = vpinsrb_avx(auVar2,0x70,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x70,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x70,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x70,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x70,0xf);
  auVar3 = vpinsrb_avx(ZEXT116(0x70),0x70,1);
  auVar3 = vpinsrb_avx(auVar3,0x70,2);
  auVar3 = vpinsrb_avx(auVar3,0x70,3);
  auVar3 = vpinsrb_avx(auVar3,0x70,4);
  auVar3 = vpinsrb_avx(auVar3,0x70,5);
  auVar3 = vpinsrb_avx(auVar3,0x70,6);
  auVar3 = vpinsrb_avx(auVar3,0x70,7);
  auVar3 = vpinsrb_avx(auVar3,0x70,8);
  auVar3 = vpinsrb_avx(auVar3,0x70,9);
  auVar3 = vpinsrb_avx(auVar3,0x70,10);
  auVar3 = vpinsrb_avx(auVar3,0x70,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x70,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x70,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x70,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x70,0xf);
  uStack_150 = auVar3._0_8_;
  uStack_148 = auVar3._8_8_;
  auVar3 = vpinsrb_avx(ZEXT116(0),0,1);
  auVar3 = vpinsrb_avx(auVar3,0,2);
  auVar3 = vpinsrb_avx(auVar3,0,3);
  auVar3 = vpinsrb_avx(auVar3,0,4);
  auVar3 = vpinsrb_avx(auVar3,0,5);
  auVar3 = vpinsrb_avx(auVar3,0,6);
  auVar3 = vpinsrb_avx(auVar3,0,7);
  auVar3 = vpinsrb_avx(auVar3,0,8);
  auVar3 = vpinsrb_avx(auVar3,0xff,9);
  auVar3 = vpinsrb_avx(auVar3,0xff,10);
  auVar3 = vpinsrb_avx(auVar3,0,0xb);
  auVar3 = vpinsrb_avx(auVar3,0,0xc);
  auVar3 = vpinsrb_avx(auVar3,0xff,0xd);
  auVar3 = vpinsrb_avx(auVar3,0,0xe);
  auVar3 = vpinsrb_avx(auVar3,0,0xf);
  auVar4 = vpinsrb_avx(ZEXT116(0),0,1);
  auVar4 = vpinsrb_avx(auVar4,0,2);
  auVar4 = vpinsrb_avx(auVar4,0,3);
  auVar4 = vpinsrb_avx(auVar4,0,4);
  auVar4 = vpinsrb_avx(auVar4,0,5);
  auVar4 = vpinsrb_avx(auVar4,0,6);
  auVar4 = vpinsrb_avx(auVar4,0,7);
  auVar4 = vpinsrb_avx(auVar4,0,8);
  auVar4 = vpinsrb_avx(auVar4,0xff,9);
  auVar4 = vpinsrb_avx(auVar4,0xff,10);
  auVar4 = vpinsrb_avx(auVar4,0,0xb);
  auVar4 = vpinsrb_avx(auVar4,0,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xff,0xd);
  auVar4 = vpinsrb_avx(auVar4,0,0xe);
  auVar4 = vpinsrb_avx(auVar4,0,0xf);
  uStack_1d0 = auVar4._0_8_;
  uStack_1c8 = auVar4._8_8_;
  auVar6 = vpunpcklqdq_avx(ZEXT816(0x80a0908884828180),ZEXT816(0x80a0908884828180));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x80a0908884828180),ZEXT816(0x80a0908884828180));
  uStack_110 = auVar4._0_8_;
  uStack_108 = auVar4._8_8_;
  auVar7 = vpunpcklqdq_avx(ZEXT816(0x8080808),ZEXT816(0x8080808));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x8080808),ZEXT816(0x8080808));
  uStack_d0 = auVar4._0_8_;
  uStack_c8 = auVar4._8_8_;
  auVar8 = vpunpcklqdq_avx(ZEXT816(0x20100800000000),ZEXT816(0x20100800000000));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x20100800000000),ZEXT816(0x20100800000000));
  uStack_90 = auVar4._0_8_;
  uStack_88 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(0x7070707),0,1);
  auVar4 = vpinsrd_avx(auVar4,0xf0f0f0f,2);
  auVar4 = vpinsrd_avx(auVar4,0x8080808,3);
  auVar5 = vpinsrd_avx(ZEXT416(0x7070707),0,1);
  auVar5 = vpinsrd_avx(auVar5,0xf0f0f0f,2);
  auVar5 = vpinsrd_avx(auVar5,0x8080808,3);
  local_600 = auVar4._0_8_;
  uStack_5f8 = auVar4._8_8_;
  uStack_5f0 = auVar5._0_8_;
  uStack_5e8 = auVar5._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(0x4070504),0x4060705,1);
  auVar4 = vpinsrd_avx(auVar4,0x4050704,2);
  auVar4 = vpinsrd_avx(auVar4,0x4050607,3);
  auVar5 = vpinsrd_avx(ZEXT416(0x7060504),0x6070605,1);
  auVar5 = vpinsrd_avx(auVar5,0x5070604,2);
  auVar5 = vpinsrd_avx(auVar5,0x5060706,3);
  auVar19 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_630 = auVar19._0_8_;
  uStack_628 = auVar19._8_8_;
  local_6b0 = in_RDI;
  local_6a8 = in_RSI;
  for (local_6a0 = in_RDX; 0x1f < local_6a0; local_6a0 = local_6a0 - 0x20) {
    auVar10 = *local_6a8;
    auVar17 = *local_6a8;
    auVar11 = *local_6a8;
    local_6a8 = local_6a8 + 1;
    auVar9._16_8_ = uStack_150;
    auVar9._0_16_ = auVar2;
    auVar9._24_8_ = uStack_148;
    auVar9 = vpaddusb_avx2(auVar9,auVar10);
    auVar10._16_8_ = uStack_190;
    auVar10._0_16_ = auVar1;
    auVar10._24_8_ = uStack_188;
    auVar10 = vpcmpeqb_avx2(auVar10,auVar11);
    auVar11._16_8_ = uStack_1d0;
    auVar11._0_16_ = auVar3;
    auVar11._24_8_ = uStack_1c8;
    auVar9 = vpshufb_avx2(auVar11,auVar9);
    auVar9 = vpor_avx2(auVar9,auVar10);
    auVar12._16_8_ = uStack_110;
    auVar12._0_16_ = auVar6;
    auVar12._24_8_ = uStack_108;
    auVar10 = vpandn_avx2(auVar9,auVar12);
    auVar13._16_8_ = uStack_d0;
    auVar13._0_16_ = auVar7;
    auVar13._24_8_ = uStack_c8;
    auVar9 = vpand_avx2(auVar9,auVar13);
    auVar14._16_8_ = uStack_90;
    auVar14._0_16_ = auVar8;
    auVar14._24_8_ = uStack_88;
    auVar10 = vpsadbw_avx2(auVar10,auVar14);
    auVar11 = vpsadbw_avx2(auVar9,ZEXT1632(ZEXT816(0)));
    auVar9 = vpsllq_avx2(auVar10,ZEXT416(0x1d));
    auVar12 = vpsrlq_avx2(auVar10,ZEXT416(7));
    auVar9 = vpor_avx2(auVar10,auVar9);
    auVar15._16_8_ = uStack_630;
    auVar15._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
    auVar15._24_8_ = uStack_628;
    auVar9 = vpermd_avx2(auVar9,auVar15);
    local_820._0_8_ = auVar9._0_8_;
    local_820._8_8_ = auVar9._8_8_;
    uStack_810 = auVar9._16_8_;
    uStack_808 = auVar9._24_8_;
    local_820._8_8_ = local_820._8_8_ ^ uStack_5f8;
    local_820._0_8_ = local_820._0_8_ ^ local_600;
    auVar16._16_8_ = uStack_810 ^ uStack_5f0;
    auVar16._0_16_ = local_820;
    auVar16._24_8_ = uStack_808 ^ uStack_5e8;
    auVar9 = vpsrlvq_avx2(auVar16,auVar11);
    auVar9 = vpshufb_avx2(auVar17,auVar9);
    local_7e0 = auVar9._0_8_;
    *local_6b0 = local_7e0;
    local_860 = auVar12._0_8_;
    uStack_7d8 = auVar9._8_8_;
    *(undefined8 *)((long)local_6b0 + local_860) = uStack_7d8;
    lStack_858 = auVar12._8_8_;
    local_6b0 = (undefined8 *)((long)local_6b0 + local_860 + lStack_858);
    uStack_7d0 = auVar9._16_8_;
    *local_6b0 = uStack_7d0;
    lStack_850 = auVar12._16_8_;
    local_6b0 = (undefined8 *)((long)local_6b0 + lStack_850);
    uStack_7c8 = auVar9._24_8_;
    *local_6b0 = uStack_7c8;
    lStack_848 = auVar12._24_8_;
    local_6b0 = (undefined8 *)(lStack_848 + (long)local_6b0);
  }
  sVar18 = despace_branchless(local_6b0,local_6a8,local_6a0);
  return (long)local_6b0 + (sVar18 - (long)in_RDI);
}

Assistant:

size_t despace_avx2_vpermd( void* dst_void, void* src_void, size_t length )
{
	uint8_t* src = (uint8_t*)src_void;
	uint8_t* dst = (uint8_t*)dst_void;

	const __m256i mask_20  = _mm256_set1_epi8( 0x20 );
	const __m256i mask_70  = _mm256_set1_epi8( 0x70 );
	const __m256i lut_cntrl = _mm256_setr_epi8(
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00,
		//
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0xFF, 0xFF, 0x00, 0x00, 0xFF, 0x00, 0x00
	);

	const __m256i mask_index = _mm256_set1_epi64x( 0x80A0908884828180 );
	const __m256i mask_shift = _mm256_set1_epi64x( 0x0000000008080808 );
	const __m256i mask_invert = _mm256_set1_epi64x( 0x0020100800000000 );
	const __m256i mask_fixup = _mm256_set_epi32(
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707,
		0x08080808, 0x0F0F0F0F, 0x00000000, 0x07070707
	);
	const __m256i lut = _mm256_set_epi32(
		0x04050607, // 0x03020100', 0x000000'07
		0x04050704, // 0x030200'00, 0x0000'0704
		0x04060705, // 0x030100'00, 0x0000'0705
		0x04070504, // 0x0300'0000, 0x00'070504
		0x05060706, // 0x020100'00, 0x0000'0706
		0x05070604, // 0x0200'0000, 0x00'070604
		0x06070605, // 0x0100'0000, 0x00'070605
		0x07060504  // 0x00'000000, 0x'07060504
	);

	for( ; length >= 32; length-=32 ){
		__m256i r0,r1,r2,r3,r4;

		r0 = _mm256_loadu_si256((__m256i *)src); // asrc
		src += 32;

		r1 = _mm256_adds_epu8(mask_70, r0);
		r2 = _mm256_cmpeq_epi8(mask_20, r0);
		r1 = _mm256_shuffle_epi8(lut_cntrl, r1);
		r1 = _mm256_or_si256(r1, r2); // bytemask of spaces

		r2 = _mm256_andnot_si256(r1, mask_index);
		r1 = _mm256_and_si256(r1, mask_shift);
		r2 = _mm256_sad_epu8(r2, mask_invert); // bitmap[0:5], popcnt[7:15]
		r1 = _mm256_sad_epu8(r1, _mm256_setzero_si256()); // shift amount
		r3 = _mm256_slli_epi64(r2, 29); // move hi index to 2nd dword
		r4 = _mm256_srli_epi64(r2, 7); // popcnt
		r2 = _mm256_or_si256(r2, r3);
		r2 = _mm256_permutevar8x32_epi32(lut, r2);
		r2 = _mm256_xor_si256(r2, mask_fixup);
		r2 = _mm256_srlv_epi64(r2, r1);
		r0 = _mm256_shuffle_epi8(r0, r2);

		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 0);
		dst += _mm256_extract_epi64(r4, 0);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 1);
		dst += _mm256_extract_epi64(r4, 1);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 2);
		dst += _mm256_extract_epi64(r4, 2);
		*((uint64_t*)dst) = _mm256_extract_epi64(r0, 3);
		dst += _mm256_extract_epi64(r4, 3);
	}
	dst += despace_branchless(dst, src, length);
	return (size_t)(dst - ((uint8_t*)dst_void));
}